

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::~AllocateFreeTestInstance
          (AllocateFreeTestInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__AllocateFreeTestInstance_00cf87c0;
  pcVar2 = (this->m_result).m_message._M_dataplus._M_p;
  paVar1 = &(this->m_result).m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_result).m_prefix._M_dataplus._M_p;
  paVar1 = &(this->m_result).m_prefix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x298);
  return;
}

Assistant:

AllocateFreeTestInstance		(Context& context, const TestConfig config)
		: TestInstance			(context)
		, m_config				(config)
		, m_result				(m_context.getTestContext().getLog())
		, m_memoryTypeIndex		(0)
		, m_memoryProperties	(getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()))
	{
		DE_ASSERT(!!m_config.memorySize != !!m_config.memoryPercentage);
	}